

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void __thiscall
soul::ResolutionPass::FunctionResolver::throwErrorForUnknownFunction
          (FunctionResolver *this,CallOrCast *call,QualifiedIdentifier *name)

{
  Context *this_00;
  Scope *this_01;
  ASTObject *pAVar1;
  CommaSeparatedList *pCVar2;
  CallOrCast *pCVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  int line;
  long lVar7;
  char *location;
  size_t sVar8;
  char *message;
  long lVar9;
  string possibleFunction;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_2a0;
  QualifiedIdentifier *local_248;
  CallOrCast *local_240;
  undefined1 local_238 [56];
  uint64_t local_200;
  uint64_t local_1f8;
  pool_ref<soul::AST::ASTObject> local_1f0 [8];
  ArrayWithPreallocation<soul::Identifier,_8UL> local_1b0;
  undefined1 local_158;
  undefined8 local_154;
  undefined1 local_14c;
  undefined2 local_14b;
  undefined1 local_149;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_238._48_8_ = local_1f0;
  local_200 = 0;
  local_1f8 = 8;
  local_1b0.items = (Identifier *)local_1b0.space;
  local_1b0.numActive = 0;
  local_1b0.numAllocated = 8;
  local_158 = 0;
  local_154 = 0x1010101ffffffff;
  local_14c = 1;
  local_14b = 0x100;
  local_149 = 0;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name->pathPrefix;
  IdentifierPath::operator+
            ((IdentifierPath *)&local_2a0,(IdentifierPath *)args_1,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  local_240 = call;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_1b0,&local_2a0);
  local_2a0.numActive = 0;
  if ((8 < local_2a0.numAllocated) && (local_2a0.items != (Identifier *)0x0)) {
    operator_delete__(local_2a0.items);
  }
  local_158 = 1;
  local_14c = 1;
  local_154 = CONCAT44(0x1010101,(undefined4)local_154);
  local_14b = 0x100;
  this_01 = (name->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  if (this_01 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_01,(NameSearch *)(local_238 + 0x30),(Statement *)0x0);
  }
  IdentifierPath::operator+
            ((IdentifierPath *)&local_2a0,(IdentifierPath *)args_1,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  sVar8 = local_2a0.numActive;
  local_2a0.numActive = 0;
  if ((8 < local_2a0.numAllocated) && (local_2a0.items != (Identifier *)0x0)) {
    operator_delete__(local_2a0.items);
  }
  if (sVar8 == 1) {
    if (local_1b0.numActive == 0) {
      throwInternalCompilerError("! empty()","back",0xaa);
    }
    IdentifierPath::withSuffix
              ((IdentifierPath *)&local_2a0,
               &((this->super_ErrorIgnoringRewritingASTVisitor).owner)->intrinsicsNamespacePath,
               local_1b0.items[local_1b0.numActive - 1].name);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_1b0,&local_2a0);
    local_2a0.numActive = 0;
    if ((8 < local_2a0.numAllocated) && (local_2a0.items != (Identifier *)0x0)) {
      operator_delete__(local_2a0.items);
    }
    AST::Scope::performFullNameSearch
              ((local_240->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
               context.parentScope,(NameSearch *)(local_238 + 0x30),(Statement *)0x0);
  }
  uVar4 = local_238._48_8_;
  local_238._40_8_ = this;
  if (local_200 != 0) {
    local_238._32_8_ = local_200;
    lVar6 = local_200 * 8;
    lVar9 = 0;
    lVar7 = 0;
    local_248 = name;
    do {
      lVar5 = *(long *)((long)(ASTObject **)uVar4 + lVar9);
      if (lVar5 != 0) {
        lVar5 = __dynamic_cast(lVar5,&AST::ASTObject::typeinfo,&AST::Function::typeinfo,0);
        lVar7 = (lVar7 + 1) - (ulong)(lVar5 == 0);
      }
      pCVar3 = local_240;
      name = local_248;
      lVar9 = lVar9 + 8;
    } while (lVar6 - lVar9 != 0);
    if (lVar7 != 0) {
      IdentifierPath::operator+
                ((IdentifierPath *)&local_2a0,(IdentifierPath *)args_1,
                 &((local_248->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_start)->path);
      pCVar2 = (pCVar3->super_CallOrCastBase).arguments.object;
      if (pCVar2 == (CommaSeparatedList *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = (pCVar2->items).numActive;
      }
      std::__cxx11::to_string((string *)local_238,sVar8);
      CompileMessageHelpers::createMessage<soul::IdentifierPath,std::__cxx11::string>
                (&local_68,(CompileMessageHelpers *)0x1,none,0x2a14d1,(char *)&local_2a0,
                 (IdentifierPath *)local_238,args_1);
      AST::Context::throwError
                (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_68,false);
    }
    if ((local_238._32_8_ != 0) && (pAVar1 = *(ASTObject **)uVar4, pAVar1 != (ASTObject *)0x0)) {
      lVar6 = __dynamic_cast(pAVar1,&AST::ASTObject::typeinfo,&AST::Processor::typeinfo,0);
      if (lVar6 != 0) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"Cannot use a processor name as a function call");
        AST::Context::throwError
                  (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_a0,false
                  );
      }
      lVar6 = __dynamic_cast(pAVar1,&AST::ASTObject::typeinfo,&AST::EndpointDeclaration::typeinfo,0)
      ;
      if (lVar6 != 0) {
        if (*(char *)(lVar6 + 0x28) == '\x01') {
          CompileMessageHelpers::createMessage<>
                    (&local_148,syntax,error,"Cannot use an input as a function call");
        }
        else {
          CompileMessageHelpers::createMessage<>
                    (&local_148,syntax,error,"Cannot use an output as a function call");
        }
        AST::Context::throwError
                  (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_148,
                   false);
      }
    }
  }
  IdentifierPath::operator+
            ((IdentifierPath *)&local_2a0,(IdentifierPath *)args_1,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  if (local_2a0.numActive == 0) {
    line = 0xaa;
    location = "back";
    message = "! empty()";
  }
  else {
    if (local_2a0.items[local_2a0.numActive - 1].name != (string *)0x0) {
      findPossibleMisspeltFunction
                ((string *)local_238,(FunctionResolver *)local_238._40_8_,
                 local_2a0.items[local_2a0.numActive - 1].name);
      local_2a0.numActive = 0;
      if ((8 < local_2a0.numAllocated) && (local_2a0.items != (Identifier *)0x0)) {
        operator_delete__(local_2a0.items);
      }
      this_00 = &(name->super_Expression).super_Statement.super_ASTObject.context;
      if (local_238._8_8_ == 0) {
        IdentifierPath::operator+
                  ((IdentifierPath *)&local_2a0,(IdentifierPath *)args_1,
                   &((name->pathSections).
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     ._M_impl.super__Vector_impl_data._M_start)->path);
        CompileMessageHelpers::createMessage<soul::IdentifierPath>
                  (&local_110,syntax,error,"Unknown function: $Q0$",(IdentifierPath *)&local_2a0);
        AST::Context::throwError(this_00,&local_110,false);
      }
      IdentifierPath::operator+
                ((IdentifierPath *)&local_2a0,(IdentifierPath *)args_1,
                 &((name->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_start)->path);
      CompileMessageHelpers::createMessage<soul::IdentifierPath,std::__cxx11::string&>
                (&local_d8,(CompileMessageHelpers *)0x1,none,0x2a157f,(char *)&local_2a0,
                 (IdentifierPath *)local_238,args_1);
      AST::Context::throwError(this_00,&local_d8,false);
    }
    line = 0x21;
    location = "operator const std::basic_string<char> &";
    message = "isValid()";
  }
  throwInternalCompilerError(message,location,line);
}

Assistant:

void throwErrorForUnknownFunction (AST::CallOrCast& call, AST::QualifiedIdentifier& name)
        {
            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = name.getPath();
            search.stopAtFirstScopeWithResults = true;
            search.findVariables = true;
            search.findTypes = true;
            search.findFunctions = true;
            search.findNamespaces = true;
            search.findProcessors = true;
            search.findProcessorInstances = false;
            search.findEndpoints = true;

            if (auto scope = name.getParentScope())
                scope->performFullNameSearch (search, nullptr);

            if (name.getPath().isUnqualified())
            {
                search.partiallyQualifiedPath = owner.intrinsicsNamespacePath.withSuffix (search.partiallyQualifiedPath.getLastPart());
                call.getParentScope()->performFullNameSearch (search, nullptr);
            }

            size_t numFunctions = 0;

            for (auto& i : search.itemsFound)
                if (is_type<AST::Function> (i))
                    ++numFunctions;

            if (numFunctions > 0)
                name.context.throwError (Errors::noFunctionWithNumberOfArgs (name.getPath(),
                                                                             std::to_string (call.getNumArguments())));

            if (! search.itemsFound.empty())
            {
                if (is_type<AST::Processor> (search.itemsFound.front()))
                    name.context.throwError (Errors::cannotUseProcessorAsFunction());

                if (auto e = cast<AST::EndpointDeclaration> (search.itemsFound.front()))
                    name.context.throwError (e->isInput ? Errors::cannotUseInputAsFunction()
                                                        : Errors::cannotUseOutputAsFunction());
            }

            auto possibleFunction = findPossibleMisspeltFunction (name.getPath().getLastPart());

            if (! possibleFunction.empty())
                name.context.throwError (Errors::unknownFunctionWithSuggestion (name.getPath(), possibleFunction));

            name.context.throwError (Errors::unknownFunction (name.getPath()));
        }